

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O3

int __thiscall
soplex::
LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remove(LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,char *__filename)

{
  int iVar1;
  pointer pnVar2;
  int *piVar3;
  int32_t iVar4;
  int extraout_EAX;
  long lVar5;
  int iVar6;
  pointer pnVar7;
  pointer pnVar8;
  byte bVar9;
  DataKey local_30;
  
  bVar9 = 0;
  iVar6 = (int)__filename;
  local_30 = (this->
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).set.thekey[iVar6];
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::remove(&this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,(char *)&local_30);
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->low).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar7 = pnVar2 + iVar1;
  pnVar8 = pnVar2 + iVar6;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar8->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
    pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar9 * -2 + 1) * 4);
    pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  pnVar2[iVar6].m_backend.exp = pnVar2[iVar1].m_backend.exp;
  pnVar2[iVar6].m_backend.neg = pnVar2[iVar1].m_backend.neg;
  iVar4 = pnVar2[iVar1].m_backend.prec_elem;
  pnVar2[iVar6].m_backend.fpclass = pnVar2[iVar1].m_backend.fpclass;
  pnVar2[iVar6].m_backend.prec_elem = iVar4;
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->up).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar7 = pnVar2 + iVar1;
  pnVar8 = pnVar2 + iVar6;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar8->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
    pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar9 * -2 + 1) * 4);
    pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  pnVar2[iVar6].m_backend.exp = pnVar2[iVar1].m_backend.exp;
  pnVar2[iVar6].m_backend.neg = pnVar2[iVar1].m_backend.neg;
  iVar4 = pnVar2[iVar1].m_backend.prec_elem;
  pnVar2[iVar6].m_backend.fpclass = pnVar2[iVar1].m_backend.fpclass;
  pnVar2[iVar6].m_backend.prec_elem = iVar4;
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->object).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar7 = pnVar2 + iVar1;
  pnVar8 = pnVar2 + iVar6;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar8->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
    pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar9 * -2 + 1) * 4);
    pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  pnVar2[iVar6].m_backend.exp = pnVar2[iVar1].m_backend.exp;
  pnVar2[iVar6].m_backend.neg = pnVar2[iVar1].m_backend.neg;
  iVar4 = pnVar2[iVar1].m_backend.prec_elem;
  pnVar2[iVar6].m_backend.fpclass = pnVar2[iVar1].m_backend.fpclass;
  pnVar2[iVar6].m_backend.prec_elem = iVar4;
  piVar3 = (this->scaleExp).data;
  piVar3[iVar6] =
       piVar3[(this->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).set.thenum];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->low,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->up,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->object,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  DataArray<int>::reSize
            (&this->scaleExp,
             (this->
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).set.thenum);
  return extraout_EAX;
}

Assistant:

void remove(int i)
   {
      SVSetBase<R>::remove(i);
      low[i] = low[num()];
      up[i] = up[num()];
      object[i] = object[num()];
      scaleExp[i] = scaleExp[num()];
      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }